

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpwm.cc
# Opt level: O0

void __thiscall UnpackerTPWM::UnpackerTPWM(UnpackerTPWM *this,PBuffer *_buffer)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  ExceptionFreeserf *pEVar4;
  element_type *this_00;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  PBuffer id;
  string local_58;
  shared_ptr<Buffer> local_28;
  PBuffer *local_18;
  PBuffer *_buffer_local;
  UnpackerTPWM *this_local;
  
  local_18 = _buffer;
  _buffer_local = (PBuffer *)this;
  std::shared_ptr<Buffer>::shared_ptr(&local_28,_buffer);
  Convertor::Convertor(&this->super_Convertor,&local_28);
  std::shared_ptr<Buffer>::~shared_ptr(&local_28);
  (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__UnpackerTPWM_001a56c0;
  peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Convertor).buffer);
  sVar3 = Buffer::get_size(peVar2);
  if (sVar3 < 8) {
    id.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
    pEVar4 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Data is not TPWM archive",
               (allocator<char> *)
               ((long)&id.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               7));
    ExceptionFreeserf::ExceptionFreeserf(pEVar4,&local_58);
    id.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
    __cxa_throw(pEVar4,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
  }
  peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Convertor).buffer);
  Buffer::pop((Buffer *)local_70,(size_t)peVar2);
  this_00 = std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  Buffer::operator_cast_to_string(&local_90,this_00);
  bVar1 = std::operator!=(&local_90,"TPWM");
  std::__cxx11::string::~string((string *)&local_90);
  if (!bVar1) {
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_70);
    return;
  }
  pEVar4 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Data is not TPWM archive",&local_b1);
  ExceptionFreeserf::ExceptionFreeserf(pEVar4,&local_b0);
  __cxa_throw(pEVar4,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

UnpackerTPWM::UnpackerTPWM(PBuffer _buffer) : Convertor(_buffer) {
  if (buffer->get_size() < 8) {
    throw ExceptionFreeserf("Data is not TPWM archive");
  }

  PBuffer id = buffer->pop(4);
  if ((std::string)*id.get() != "TPWM") {
    throw ExceptionFreeserf("Data is not TPWM archive");
  }
}